

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,size_t size
              ,char **err)

{
  OffsetData *offset_data;
  EXRHeader *exr_header;
  long *plVar1;
  pointer pvVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  pointer pOVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  pointer __n;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  pointer pOVar17;
  ulong uVar18;
  long lVar19;
  ulong *puVar20;
  bool bVar21;
  string e;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> chunk_offset_table_list;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  int local_dc;
  int local_d8;
  undefined1 local_c8 [32];
  pointer local_a8;
  pointer local_a0;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_58;
  EXRImage *local_40;
  pointer local_38;
  
  if (size < 9 ||
      ((memory == (uchar *)0x0 || num_parts == 0) ||
      (exr_headers == (EXRHeader **)0x0 || exr_images == (EXRImage *)0x0))) {
    pcVar14 = "Invalid argument for LoadEXRMultipartImageFromMemory()";
    pcVar9 = "";
LAB_0010b632:
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,pcVar14,pcVar9);
    uVar3 = local_c8._0_8_;
    if (err != (char **)0x0) {
      pcVar9 = strdup((char *)local_c8._0_8_);
      *err = pcVar9;
    }
    if ((undefined1 *)uVar3 != local_c8 + 0x10) {
      operator_delete((void *)uVar3);
    }
    local_d8 = -3;
  }
  else {
    __n = (pointer)(ulong)num_parts;
    pOVar6 = (pointer)0x0;
    lVar12 = 0;
    do {
      if ((ulong)exr_headers[(long)pOVar6]->header_len == 0) {
        pcVar14 = "EXRHeader variable is not initialized.";
        pcVar9 = "";
        goto LAB_0010b632;
      }
      lVar12 = lVar12 + (ulong)exr_headers[(long)pOVar6]->header_len;
      pOVar6 = (pointer)((long)&(pOVar6->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (__n != pOVar6);
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = exr_images;
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::reserve
              (&local_98,(size_type)__n);
    puVar20 = (ulong *)(memory + lVar12 + 9);
    local_d8 = -3;
    bVar21 = true;
    local_a8 = (pointer)0x0;
    do {
      std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::resize
                (&local_98,
                 ((long)local_98.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
      offset_data = local_98.
                    super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                    _M_impl.super__Vector_impl_data._M_finish + -1;
      exr_header = exr_headers[(long)local_a8];
      if ((exr_header->tiled == 0) || (exr_header->tile_level_mode == 0)) {
        tinyexr::InitSingleResolutionOffsets(offset_data,(long)exr_header->chunk_count);
        plVar1 = *(long **)&(((offset_data->offsets).
                              super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            )._M_impl;
        lVar12 = *plVar1;
        lVar15 = plVar1[1] - lVar12;
        if (lVar15 != 0) {
          lVar15 = lVar15 >> 3;
          lVar19 = 0;
LAB_0010b4a2:
          if (*puVar20 < size) goto code_r0x0010b4af;
          local_c8._0_8_ = local_c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"Invalid offset size in EXR header chunks.","");
LAB_0010b6ac:
          uVar3 = local_c8._0_8_;
          if (err != (char **)0x0) {
            pcVar9 = strdup((char *)local_c8._0_8_);
            *err = pcVar9;
          }
          if ((pointer)uVar3 != (pointer)(local_c8 + 0x10)) {
            operator_delete((void *)uVar3);
          }
          local_d8 = -4;
          if (!bVar21) break;
          goto LAB_0010b8af;
        }
      }
      else {
        local_38 = local_98.
                   super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        bVar4 = tinyexr::PrecalculateTileInfo(&local_58,&local_78,exr_header);
        pOVar6 = local_a8;
        if (bVar4) {
          local_a0 = (pointer)memory;
          iVar5 = tinyexr::InitTileOffsets
                            (offset_data,
                             (EXRHeader *)(ulong)(uint)exr_headers[(long)local_a8]->tile_level_mode,
                             &local_58,&local_78);
          memory = (uchar *)local_a0;
          bVar4 = true;
          if (iVar5 != exr_headers[(long)pOVar6]->chunk_count) {
            local_c8._0_8_ = local_c8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"Invalid offset table size.","");
            goto LAB_0010b4ea;
          }
        }
        else {
          local_c8._0_8_ = local_c8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c8,"Invalid tile info.","");
LAB_0010b4ea:
          uVar3 = local_c8._0_8_;
          if (err != (char **)0x0) {
            pcVar9 = strdup((char *)local_c8._0_8_);
            *err = pcVar9;
          }
          if ((pointer)uVar3 != (pointer)(local_c8 + 0x10)) {
            operator_delete((void *)uVar3);
          }
          local_d8 = -4;
          bVar4 = false;
        }
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (!bVar4) goto LAB_0010b8af;
        pvVar2 = local_38[-1].offsets.
                 super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar12 = (long)local_38[-1].offsets.
                       super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
        if (lVar12 != 0) {
          uVar7 = (lVar12 >> 3) * -0x5555555555555555;
          uVar10 = 0;
          do {
            lVar12 = *(long *)&pvVar2[uVar10].
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ;
            lVar15 = (long)*(pointer *)
                            ((long)&pvVar2[uVar10].
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl + 8) - lVar12;
            local_a0 = pvVar2;
            if (lVar15 != 0) {
              uVar16 = (lVar15 >> 3) * -0x5555555555555555;
              uVar18 = 0;
              do {
                lVar15 = *(long *)(lVar12 + uVar18 * 0x18);
                lVar19 = *(long *)(lVar12 + 8 + uVar18 * 0x18) - lVar15;
                if (lVar19 != 0) {
                  uVar13 = 0;
                  uVar11 = 1;
                  do {
                    if (size <= *puVar20) {
                      local_c8._0_8_ = local_c8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_c8,"Invalid offset size in EXR header chunks.","");
                      goto LAB_0010b6ac;
                    }
                    *(ulong *)(lVar15 + uVar13 * 8) = *puVar20 + 4;
                    puVar20 = puVar20 + 1;
                    bVar4 = uVar11 < (ulong)(lVar19 >> 3);
                    uVar13 = uVar11;
                    uVar11 = (ulong)((int)uVar11 + 1);
                  } while (bVar4);
                }
                uVar18 = (ulong)((int)uVar18 + 1);
              } while (uVar18 <= uVar16 && uVar16 - uVar18 != 0);
            }
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
        }
      }
LAB_0010b5fd:
      local_a8 = (pointer)((long)&(local_a8->offsets).
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
      bVar21 = local_a8 < __n;
    } while (local_a8 != __n);
    pOVar6 = (pointer)0x0;
    local_dc = local_d8;
    do {
      pvVar2 = local_98.
               super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>._M_impl
               .super__Vector_impl_data._M_start[(long)pOVar6].offsets.
               super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8 = local_98.
                 super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)local_98.
                     super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pOVar6].offsets.
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
      if (lVar12 != 0) {
        uVar7 = (lVar12 >> 3) * -0x5555555555555555;
        uVar10 = 0;
        do {
          lVar12 = *(long *)&pvVar2[uVar10].
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl;
          lVar15 = (long)*(pointer *)
                          ((long)&pvVar2[uVar10].
                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                  ._M_impl + 8) - lVar12;
          if (lVar15 != 0) {
            uVar16 = (lVar15 >> 3) * -0x5555555555555555;
            uVar18 = 0;
            do {
              lVar15 = *(long *)(lVar12 + uVar18 * 0x18);
              lVar19 = *(long *)(lVar12 + 8 + uVar18 * 0x18) - lVar15;
              if (lVar19 != 0) {
                uVar13 = 1;
                uVar11 = 0;
                do {
                  uVar8 = uVar13;
                  if (pOVar6 != (pointer)(ulong)*(uint *)((long)memory +
                                                         *(long *)(lVar15 + uVar11 * 8) + -4)) {
                    local_c8._0_8_ = local_c8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_c8,"Invalid `part number\' in EXR header chunks.","")
                    ;
                    uVar3 = local_c8._0_8_;
                    if (err != (char **)0x0) {
                      pcVar9 = strdup((char *)local_c8._0_8_);
                      *err = pcVar9;
                    }
                    if ((pointer)uVar3 != (pointer)(local_c8 + 0x10)) {
                      operator_delete((void *)uVar3);
                    }
                    local_d8 = -4;
                    goto LAB_0010b8af;
                  }
                  uVar13 = (ulong)((int)uVar8 + 1);
                  uVar11 = uVar8;
                } while (uVar8 < (ulong)(lVar19 >> 3));
              }
              uVar18 = (ulong)((int)uVar18 + 1);
            } while (uVar18 <= uVar16 && uVar16 - uVar18 != 0);
          }
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
      }
      local_c8._0_8_ = local_c8 + 0x10;
      local_c8._8_8_ = 0;
      local_c8[0x10] = '\0';
      iVar5 = tinyexr::DecodeChunk
                        (local_40 + (long)pOVar6,exr_headers[(long)pOVar6],
                         local_98.
                         super__Vector_base<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)pOVar6,memory,size,
                         (string *)local_c8);
      pOVar17 = (pointer)local_c8._0_8_;
      if (((iVar5 != 0) && (local_dc = iVar5, err != (char **)0x0)) && (local_c8._8_8_ != 0)) {
        local_a8 = (pointer)local_c8._0_8_;
        pcVar9 = strdup((char *)local_c8._0_8_);
        *err = pcVar9;
        pOVar17 = local_a8;
      }
      if (pOVar17 != (pointer)(local_c8 + 0x10)) {
        operator_delete(pOVar17);
      }
      if (iVar5 != 0) {
        local_d8 = local_dc;
        break;
      }
      pOVar6 = (pointer)((long)&(pOVar6->offsets).
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
      local_d8 = 0;
    } while (pOVar6 != __n);
LAB_0010b8af:
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector(&local_98);
  }
  return local_d8;
code_r0x0010b4af:
  *(ulong *)(lVar12 + lVar19 * 8) = *puVar20 + 4;
  puVar20 = puVar20 + 1;
  lVar19 = lVar19 + 1;
  if (lVar15 + (ulong)(lVar15 == 0) == lVar19) goto LAB_0010b5fd;
  goto LAB_0010b4a2;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const size_t size, const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL || (size <= tinyexr::kEXRVersionSize)) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromMemory()", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      tinyexr::SetErrorMessage("EXRHeader variable is not initialized.", err);
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<tinyexr::OffsetData> chunk_offset_table_list;
  chunk_offset_table_list.reserve(num_parts);
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    chunk_offset_table_list.resize(chunk_offset_table_list.size() + 1);
    tinyexr::OffsetData& offset_data = chunk_offset_table_list.back();
    if (!exr_headers[i]->tiled || exr_headers[i]->tile_level_mode == TINYEXR_TILE_ONE_LEVEL) {
      tinyexr::InitSingleResolutionOffsets(offset_data, size_t(exr_headers[i]->chunk_count));
      std::vector<tinyexr::tinyexr_uint64>& offset_table = offset_data.offsets[0][0];

      for (size_t c = 0; c < offset_table.size(); c++) {
        tinyexr::tinyexr_uint64 offset;
        memcpy(&offset, marker, 8);
        tinyexr::swap8(&offset);

        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                                   err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        offset_table[c] = offset + 4;  // +4 to skip 'part number'
        marker += 8;
      }
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        if (!tinyexr::PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i])) {
          tinyexr::SetErrorMessage("Invalid tile info.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
        int num_blocks = InitTileOffsets(offset_data, exr_headers[i], num_x_tiles, num_y_tiles);
        if (num_blocks != exr_headers[i]->chunk_count) {
          tinyexr::SetErrorMessage("Invalid offset table size.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
      }
      for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
        for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
          for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
            tinyexr::tinyexr_uint64 offset;
            memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
            tinyexr::swap8(&offset);
            if (offset >= size) {
              tinyexr::SetErrorMessage("Invalid offset size in EXR header chunks.",
                err);
              return TINYEXR_ERROR_INVALID_DATA;
            }
            offset_data.offsets[l][dy][dx] = offset + 4; // +4 to skip 'part number'
            marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
          }
        }
      }
    }
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    tinyexr::OffsetData &offset_data = chunk_offset_table_list[i];

    // First check 'part number' is identical to 'i'
    for (unsigned int l = 0; l < offset_data.offsets.size(); ++l)
      for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy)
        for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {

          const unsigned char *part_number_addr =
              memory + offset_data.offsets[l][dy][dx] - 4;  // -4 to move to 'part number' field.
          unsigned int part_no;
          memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
          tinyexr::swap4(&part_no);

          if (part_no != i) {
            tinyexr::SetErrorMessage("Invalid `part number' in EXR header chunks.",
                                     err);
            return TINYEXR_ERROR_INVALID_DATA;
          }
        }

    std::string e;
    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_data,
                                   memory, size, &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}